

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O1

size_t bin_text_read_write_fixed_validated
                 (io_buf *io,char *data,size_t len,char *read_message,bool read,stringstream *msg,
                 bool text)

{
  size_t sVar1;
  vw_exception *this;
  undefined7 in_register_00000081;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if ((int)CONCAT71(in_register_00000081,read) == 0) {
    sVar1 = bin_text_write_fixed(io,data,len,msg,text);
  }
  else {
    sVar1 = io_buf::bin_read_fixed(io,data,len,read_message);
  }
  if ((len == 0 || !read) || sVar1 != 0) {
    return sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"Unexpected end of file encountered.",0x23);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/io_buf.h"
             ,0x15c,&local_1c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

inline size_t bin_text_read_write_fixed_validated(
    io_buf& io, char* data, size_t len, const char* read_message, bool read, std::stringstream& msg, bool text)
{
  size_t nbytes = bin_text_read_write_fixed(io, data, len, read_message, read, msg, text);
  if (read && len > 0)  // only validate bytes read/write if expected length > 0
  {
    if (nbytes == 0)
    {
      THROW("Unexpected end of file encountered.");
    }
  }
  return nbytes;
}